

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O1

bool list_chibi_targets(char *build_root,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *library_targets,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *app_targets)

{
  pointer ppCVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer ppCVar3;
  ChibiInfo chibi_info;
  ChibiInfo CStack_88;
  
  CStack_88.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &CStack_88.build_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  CStack_88.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  CStack_88.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  CStack_88.build_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CStack_88.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  CStack_88.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CStack_88.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CStack_88.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  CStack_88.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CStack_88.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CStack_88.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       CStack_88.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = chibi_process(&CStack_88,build_root,true,(char *)0x0);
  ppCVar1 = CStack_88.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = CStack_88.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (bVar2) {
    for (; ppCVar3 != ppCVar1; ppCVar3 = ppCVar3 + 1) {
      this = app_targets;
      if ((*ppCVar3)->isExecutable == false) {
        this = library_targets;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&(*ppCVar3)->name);
    }
  }
  ChibiInfo::~ChibiInfo(&CStack_88);
  return bVar2;
}

Assistant:

bool list_chibi_targets(const char * build_root, std::vector<std::string> & library_targets, std::vector<std::string> & app_targets)
{
	ChibiInfo chibi_info;
	
	//
	
	if (chibi_process(chibi_info, build_root, true, nullptr) == false)
		return false;
	
	//
	
	for (auto * library : chibi_info.libraries)
	{
		if (library->isExecutable)
			app_targets.push_back(library->name);
		else
			library_targets.push_back(library->name);
	}
	
	return true;
}